

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner.h
# Opt level: O2

string * __thiscall
trun::DirScanner::GetExtension(string *__return_storage_ptr__,DirScanner *this,string *pathName)

{
  char __c;
  size_type sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = pathName->_M_string_length;
  while( true ) {
    sVar1 = sVar1 - 1;
    if (sVar1 == 0) {
      return __return_storage_ptr__;
    }
    __c = (pathName->_M_dataplus)._M_p[sVar1];
    if (__c == '.') break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,(__const_iterator)(__return_storage_ptr__->_M_dataplus)._M_p,
               __c);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (__return_storage_ptr__,0,".");
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtension(std::string &pathName) {
            std::string ext;
            auto l = pathName.length() - 1;
            while ((l > 0) && (pathName[l] != '.')) {
                ext.insert(ext.begin(), pathName[l]);
                l--;
            }
            if ((l > 0) && (pathName[l] == '.')) {
                ext.insert(0, ".");
            }
            return ext;
        }